

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_compareEquivalentNonStandardUnitsOneUnitsWithParentModel_Test::
~Units_compareEquivalentNonStandardUnitsOneUnitsWithParentModel_Test
          (Units_compareEquivalentNonStandardUnitsOneUnitsWithParentModel_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, compareEquivalentNonStandardUnitsOneUnitsWithParentModel)
{
    libcellml::ModelPtr m = libcellml::Model::create();

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("millisecond");
    u->addUnit("second", "milli");

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("per_millisecond");
    u1->addUnit("millisecond", -1);

    m->addUnits(u);
    m->addUnits(u1);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("per_millisecond");
    u2->addUnit("millisecond", -1);

    // Cannot resolve reference to millisecond in u2 so
    // the two units are not considered equivalent.
    EXPECT_FALSE(libcellml::Units::equivalent(u1, u2));
}